

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  FTP *pFVar2;
  char command;
  FTP *ftp;
  char *type;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pFVar2 = (FTP *)(*Curl_ccalloc)(0x20,1);
  (data->req).p.ftp = pFVar2;
  if (pFVar2 == (FTP *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pFVar2->path = (data->state).up.path + 1;
    ftp = (FTP *)strstr(pFVar2->path,";type=");
    if (ftp == (FTP *)0x0) {
      ftp = (FTP *)strstr((conn->host).rawalloc,";type=");
    }
    if (ftp != (FTP *)0x0) {
      *(undefined1 *)&ftp->path = 0;
      cVar1 = Curl_raw_toupper(*(char *)((long)&ftp->path + 6));
      if (cVar1 == 'A') {
        *(uint *)&(data->state).field_0x6d0 =
             *(uint *)&(data->state).field_0x6d0 & 0xffff7fff | 0x8000;
      }
      else if (cVar1 == 'D') {
        *(uint *)&(data->state).field_0x6d0 =
             *(uint *)&(data->state).field_0x6d0 & 0xfffeffff | 0x10000;
      }
      else {
        *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xffff7fff;
      }
    }
    pFVar2->transfer = PPTRANSFER_BODY;
    pFVar2->downloadsize = 0;
    (conn->proto).ftpc.known_filesize = -1;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  char *type;
  struct FTP *ftp;

  data->req.p.ftp = ftp = calloc(sizeof(struct FTP), 1);
  if(!ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->state.list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = PPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}